

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocman.cpp
# Opt level: O0

void __thiscall despot::Pocman::NewLevel(Pocman *this,PocmanState *pocstate)

{
  undefined7 uVar1;
  bool bVar2;
  int iVar3;
  reference pvVar4;
  reference pvVar5;
  int *piVar6;
  int iVar7;
  double dVar8;
  reference local_48;
  reference local_38;
  int local_28;
  int local_24;
  int pocIndex;
  int y;
  int x;
  int g;
  PocmanState *pocstate_local;
  Pocman *this_local;
  
  uVar1 = *(undefined7 *)&this->field_0x3d;
  pocstate->pocman_pos = this->pocman_home_;
  *(undefined7 *)&pocstate->field_0x21 = uVar1;
  _x = pocstate;
  pocstate_local = (PocmanState *)this;
  for (y = 0; y < this->num_ghosts_; y = y + 1) {
    pvVar4 = std::vector<despot::Coord,_std::allocator<despot::Coord>_>::operator[]
                       (&_x->ghost_pos,(long)y);
    *(undefined8 *)pvVar4 = *(undefined8 *)&this->ghost_home_;
    iVar7 = y % 2;
    pvVar4 = std::vector<despot::Coord,_std::allocator<despot::Coord>_>::operator[]
                       (&_x->ghost_pos,(long)y);
    *(int *)pvVar4 = iVar7 + *(int *)pvVar4;
    iVar7 = y / 2;
    pvVar4 = std::vector<despot::Coord,_std::allocator<despot::Coord>_>::operator[]
                       (&_x->ghost_pos,(long)y);
    *(int *)(pvVar4 + 4) = iVar7 + *(int *)(pvVar4 + 4);
    pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&_x->ghost_dir,(long)y);
    *pvVar5 = -1;
  }
  _x->num_food = 0;
  pocIndex = 0;
  do {
    iVar7 = pocIndex;
    iVar3 = Grid<int>::xsize(&this->maze_);
    if (iVar3 <= iVar7) {
      _x->power_steps = 0;
      return;
    }
    for (local_24 = 0; iVar7 = local_24, iVar3 = Grid<int>::ysize(&this->maze_), iVar7 < iVar3;
        local_24 = local_24 + 1) {
      local_28 = Grid<int>::Index(&this->maze_,pocIndex,local_24);
      piVar6 = Grid<int>::operator()(&this->maze_,pocIndex,local_24);
      bVar2 = CheckFlag(*piVar6,1);
      if (bVar2) {
        piVar6 = Grid<int>::operator()(&this->maze_,pocIndex,local_24);
        bVar2 = CheckFlag(*piVar6,2);
        if ((!bVar2) && (dVar8 = (double)despot::Random::NextDouble(), this->food_prob_ <= dVar8))
        goto LAB_00118dae;
        local_38 = std::vector<bool,_std::allocator<bool>_>::operator[](&_x->food,(long)local_28);
        std::_Bit_reference::operator=(&local_38,true);
        _x->num_food = _x->num_food + 1;
      }
      else {
LAB_00118dae:
        local_48 = std::vector<bool,_std::allocator<bool>_>::operator[](&_x->food,(long)local_28);
        std::_Bit_reference::operator=(&local_48,false);
      }
    }
    pocIndex = pocIndex + 1;
  } while( true );
}

Assistant:

void Pocman::NewLevel(PocmanState& pocstate) const {
	pocstate.pocman_pos = pocman_home_;
	for (int g = 0; g < num_ghosts_; g++) {
		pocstate.ghost_pos[g] = ghost_home_;
		pocstate.ghost_pos[g].x += g % 2;
		pocstate.ghost_pos[g].y += g / 2;
		pocstate.ghost_dir[g] = -1;
	}

	pocstate.num_food = 0;
	for (int x = 0; x < maze_.xsize(); x++) {
		for (int y = 0; y < maze_.ysize(); y++) {
			int pocIndex = maze_.Index(x, y);
			// cout << maze_(x, y) << " " << CheckFlag(maze_(x, y), E_SEED) << " " << CheckFlag(maze_(x, y), E_POWER) << endl;
			if (CheckFlag(maze_(x, y), E_SEED)
				&& (CheckFlag(maze_(x, y), E_POWER)
					|| Random::RANDOM.NextDouble() < food_prob_)) {
				pocstate.food[pocIndex] = 1;
				pocstate.num_food++;
			} else {
				pocstate.food[pocIndex] = 0;
			}
		}
	}

	pocstate.power_steps = 0;
}